

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TagAliasRegistry::add
          (TagAliasRegistry *this,string *alias,string *tag,SourceLineInfo *lineInfo)

{
  string *__x;
  bool bVar1;
  byte bVar2;
  int iVar3;
  ReusableStringStream *pRVar4;
  undefined4 extraout_var;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TagAlias>_>::value,_pair<iterator,_bool>_>
  _Var5;
  bool local_19a;
  ReusableStringStream local_180;
  string local_168;
  _Base_ptr local_148;
  byte local_140;
  char *local_138;
  size_t sStack_130;
  TagAlias local_128;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  local_f8;
  _Base_ptr local_a8;
  byte local_a0;
  ReusableStringStream local_98;
  string local_80;
  allocator local_49;
  string local_48;
  SourceLineInfo *local_28;
  SourceLineInfo *lineInfo_local;
  string *tag_local;
  string *alias_local;
  TagAliasRegistry *this_local;
  
  local_28 = lineInfo;
  lineInfo_local = (SourceLineInfo *)tag;
  tag_local = alias;
  alias_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"[@",&local_49);
  bVar1 = startsWith(alias,&local_48);
  local_19a = false;
  if (bVar1) {
    local_19a = endsWith(tag_local,']');
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  __x = tag_local;
  if (((local_19a ^ 0xffU) & 1) != 0) {
    ReusableStringStream::ReusableStringStream(&local_98);
    pRVar4 = ReusableStringStream::operator<<(&local_98,(char (*) [20])"error: tag alias, \'");
    pRVar4 = ReusableStringStream::operator<<(pRVar4,tag_local);
    pRVar4 = ReusableStringStream::operator<<
                       (pRVar4,(char (*) [37])"\' is not of the form [@alias name].\n");
    pRVar4 = ReusableStringStream::operator<<(pRVar4,local_28);
    ReusableStringStream::str_abi_cxx11_(&local_80,pRVar4);
    throw_domain_error(&local_80);
  }
  local_138 = local_28->file;
  sStack_130 = local_28->line;
  TagAlias::TagAlias(&local_128,(string *)lineInfo_local,*local_28);
  std::make_pair<std::__cxx11::string_const&,Catch::TagAlias>(&local_f8,__x,&local_128);
  _Var5 = std::
          map<std::__cxx11::string,Catch::TagAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
          ::insert<std::pair<std::__cxx11::string,Catch::TagAlias>>
                    ((map<std::__cxx11::string,Catch::TagAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                      *)&this->m_registry,&local_f8);
  local_148 = (_Base_ptr)_Var5.first._M_node;
  local_140 = _Var5.second;
  bVar2 = local_140 ^ 0xff;
  local_a8 = local_148;
  local_a0 = local_140;
  clara::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  ::~pair(&local_f8);
  TagAlias::~TagAlias(&local_128);
  if ((bVar2 & 1) != 0) {
    ReusableStringStream::ReusableStringStream(&local_180);
    pRVar4 = ReusableStringStream::operator<<(&local_180,(char (*) [20])"error: tag alias, \'");
    pRVar4 = ReusableStringStream::operator<<(pRVar4,tag_local);
    pRVar4 = ReusableStringStream::operator<<(pRVar4,(char (*) [23])"\' already registered.\n");
    pRVar4 = ReusableStringStream::operator<<(pRVar4,(char (*) [17])"\tFirst seen at: ");
    iVar3 = (*(this->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(this,tag_local);
    pRVar4 = ReusableStringStream::operator<<
                       (pRVar4,(SourceLineInfo *)(CONCAT44(extraout_var,iVar3) + 0x20));
    pRVar4 = ReusableStringStream::operator<<(pRVar4,(char (*) [2])0x268c6b);
    pRVar4 = ReusableStringStream::operator<<(pRVar4,(char (*) [16])"\tRedefined at: ");
    pRVar4 = ReusableStringStream::operator<<(pRVar4,local_28);
    ReusableStringStream::str_abi_cxx11_(&local_168,pRVar4);
    throw_domain_error(&local_168);
  }
  return;
}

Assistant:

void TagAliasRegistry::add( std::string const& alias, std::string const& tag, SourceLineInfo const& lineInfo ) {
        CATCH_ENFORCE( startsWith(alias, "[@") && endsWith(alias, ']'),
                      "error: tag alias, '" << alias << "' is not of the form [@alias name].\n" << lineInfo );

        CATCH_ENFORCE( m_registry.insert(std::make_pair(alias, TagAlias(tag, lineInfo))).second,
                      "error: tag alias, '" << alias << "' already registered.\n"
                      << "\tFirst seen at: " << find(alias)->lineInfo << "\n"
                      << "\tRedefined at: " << lineInfo );
    }